

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O3

string * __thiscall
libtorrent::make_magnet_uri_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,torrent_handle *handle)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  size_t in_RCX;
  pointer paVar3;
  span<const_char> in;
  string_view str;
  string_view str_00;
  string_view str_01;
  torrent_status st;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  sha1_hash local_27c;
  undefined1 local_268 [104];
  _Alloc_hider local_200;
  char *local_1f8;
  
  bVar1 = torrent_handle::is_valid((torrent_handle *)this);
  local_288 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_288;
  if (bVar1) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    torrent_handle::info_hash(&local_27c,(torrent_handle *)this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    in.m_len = in_RCX;
    in.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_((string *)local_268,(aux *)&local_27c,in);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_268._0_8_);
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    torrent_handle::status((torrent_status *)local_268,(torrent_handle *)this,(status_flags_t)0x40);
    if (local_1f8 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      str.len_ = in_RCX;
      str.ptr_ = local_1f8;
      escape_string_abi_cxx11_((string *)local_2b8,(libtorrent *)local_200._M_p,str);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_2b8._0_8_);
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
    }
    torrent_handle::trackers
              ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *)
               local_2d8,(torrent_handle *)this);
    if (local_2d8._0_8_ != local_2d8._8_8_) {
      paVar3 = (pointer)local_2d8._0_8_;
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        str_00.len_ = in_RCX;
        str_00.ptr_ = (char *)(paVar3->url)._M_string_length;
        escape_string_abi_cxx11_
                  ((string *)local_2b8,(libtorrent *)(paVar3->url)._M_dataplus._M_p,str_00);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_2b8._0_8_);
        if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        paVar3 = paVar3 + 1;
      } while (paVar3 != (pointer)local_2d8._8_8_);
    }
    std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>::~vector
              ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *)
               local_2d8);
    torrent_handle::url_seeds_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b8,(torrent_handle *)this);
    if ((_Rb_tree_node_base *)local_2b8._24_8_ != (_Rb_tree_node_base *)(local_2b8 + 8)) {
      p_Var2 = (_Rb_tree_node_base *)local_2b8._24_8_;
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        str_01.len_ = in_RCX;
        str_01.ptr_ = (char *)p_Var2[1]._M_parent;
        escape_string_abi_cxx11_((string *)local_2d8,*(libtorrent **)(p_Var2 + 1),str_01);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_2d8._0_8_);
        if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      } while (p_Var2 != (_Rb_tree_node_base *)(local_2b8 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b8);
    torrent_status::~torrent_status((torrent_status *)local_268);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_magnet_uri(torrent_handle const& handle)
	{
		if (!handle.is_valid()) return "";

		std::string ret;
		sha1_hash const& ih = handle.info_hash();
		ret += "magnet:?xt=urn:btih:";
		ret += aux::to_hex(ih);

		torrent_status st = handle.status(torrent_handle::query_name);
		if (!st.name.empty())
		{
			ret += "&dn=";
			ret += escape_string(st.name);
		}

		for (auto const& tr : handle.trackers())
		{
			ret += "&tr=";
			ret += escape_string(tr.url);
		}

		for (auto const& s : handle.url_seeds())
		{
			ret += "&ws=";
			ret += escape_string(s);
		}

		return ret;
	}